

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
TargetPropertyEntryString::~TargetPropertyEntryString(TargetPropertyEntryString *this)

{
  (this->super_TargetPropertyEntry)._vptr_TargetPropertyEntry =
       (_func_int **)&PTR__TargetPropertyEntryString_00539480;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->Backtrace).TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->PropertyValue);
  cmGeneratorTarget::TargetPropertyEntry::~TargetPropertyEntry(&this->super_TargetPropertyEntry);
  return;
}

Assistant:

TargetPropertyEntryString(std::string propertyValue,
                            cmListFileBacktrace backtrace,
                            cmLinkImplItem const& item = NoLinkImplItem)
    : cmGeneratorTarget::TargetPropertyEntry(item)
    , PropertyValue(std::move(propertyValue))
    , Backtrace(std::move(backtrace))
  {
  }